

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.cpp
# Opt level: O3

void baoliSearch(int curlv,int remainF,int remainA,int gridSz)

{
  double dVar1;
  float fVar2;
  long lVar3;
  pointer pGVar4;
  ostream *poVar5;
  long lVar6;
  pointer pPVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  pointer ppiVar14;
  int *piVar15;
  ulong uVar16;
  int iVar17;
  int *piVar18;
  int iVar19;
  int *piVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  int tAssignN [4];
  int local_b8 [6];
  BelongStructure *local_a0;
  long local_98;
  long local_90;
  pointer local_88;
  long local_80;
  int local_78 [18];
  
  if (curlv == gridSz || remainA == 0 && remainF == 0) {
    lVar3 = std::chrono::_V2::system_clock::now();
    restime.__r = (lVar3 - (long)logtime.__d.__r) / 1000;
    if (0x37e11d9e7 < lVar3 - (long)logtime.__d.__r) {
      poVar5 = std::operator<<((ostream *)&std::cout,"ERROR:TLE");
      std::endl<char,std::char_traits<char>>(poVar5);
      exit(0);
    }
    local_b8[0] = 0;
    local_b8[1] = 0;
    local_b8[2] = 0;
    local_b8[3] = 0;
    if (gridSz < 1) {
      lVar3 = 0;
      lVar6 = 0;
      lVar9 = 0;
      lVar13 = 0;
    }
    else {
      lVar3 = 0;
      pGVar4 = gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (*(int *)((long)sign + lVar3) == 2) {
          local_b8[pGVar4->carrierPos] = local_b8[pGVar4->carrierPos] + 1;
        }
        pGVar4 = pGVar4 + 1;
        lVar3 = lVar3 + 4;
      } while ((ulong)(uint)gridSz << 2 != lVar3);
      lVar13 = (long)local_b8[0];
      lVar9 = (long)local_b8[1];
      lVar6 = (long)local_b8[2];
      lVar3 = (long)local_b8[3];
    }
    ppiVar14 = dpRes[lVar13][lVar9][lVar6][lVar3].belongings.
               super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
               _M_start;
    local_88 = *(pointer *)
                ((long)&dpRes[lVar13][lVar9][lVar6][lVar3].belongings.
                        super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                        super__Vector_impl_data + 8);
    if (ppiVar14 != local_88) {
      local_a0 = dpRes[lVar13][lVar9][lVar6] + lVar3;
      uVar10 = (ulong)(uint)gridSz;
      local_90 = (long)gridSz;
      local_80 = 0;
      local_98 = uVar10 * 4;
      do {
        piVar18 = *ppiVar14;
        lVar3 = 0;
        do {
          *(undefined4 *)((long)curAssign + lVar3) = *(undefined4 *)((long)piVar18 + lVar3);
          fVar2 = op_coef;
          lVar3 = lVar3 + 4;
        } while (lVar3 != 0x40);
        fVar22 = *(float *)((long)(local_a0->as).super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + local_80 * 4);
        local_78[0xc] = 0;
        local_78[0xd] = 0;
        local_78[0xe] = 0;
        local_78[0xf] = 0;
        local_78[8] = 0;
        local_78[9] = 0;
        local_78[10] = 0;
        local_78[0xb] = 0;
        local_78[4] = 0;
        local_78[5] = 0;
        local_78[6] = 0;
        local_78[7] = 0;
        local_78[0] = 0;
        local_78[1] = 0;
        local_78[2] = 0;
        local_78[3] = 0;
        fVar23 = 0.0;
        if (0 < gridSz) {
          uVar16 = 0;
          iVar17 = 0;
          do {
            if (sign[uVar16] == 1) {
              lVar3 = (long)iVar17;
              iVar17 = iVar17 + 1;
              fVar21 = formulaDamageOP(gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>.
                                       _M_impl.super__Vector_impl_data._M_start[uVar16].gridSizeFsb,
                                       planeVecF.super__Vector_base<Plane,_std::allocator<Plane>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar3);
              fVar23 = fVar23 + fVar21;
            }
            else if ((sign[uVar16] == 2) && (0 < (long)curBomberNum)) {
              piVar15 = curAssign;
              lVar3 = 0;
              piVar20 = curAssignGrid;
              piVar18 = local_78;
              do {
                if ((gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16].carrierPos == *piVar15) &&
                   (*piVar18 == 0)) {
                  fVar21 = formulaDamageOP(gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar16].
                                           gridSizeFsb,
                                           (Plane *)((long)planeVecA.
                                                                                                                      
                                                  super__Vector_base<Plane,_std::allocator<Plane>_>.
                                                  _M_impl.super__Vector_impl_data._M_start - lVar3))
                  ;
                  fVar23 = fVar23 + fVar21;
                  *piVar18 = 1;
                  *piVar20 = gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar16].gridPos;
                  break;
                }
                piVar18 = piVar18 + 1;
                piVar20 = piVar20 + 1;
                lVar3 = lVar3 + -0x38;
                piVar15 = piVar15 + 1;
              } while ((long)curBomberNum * 0x38 + lVar3 != 0);
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar10);
        }
        fVar22 = fVar2 * fVar23 + fVar22;
        if (resAtk < fVar22) {
          iVar17 = 0;
          iVar12 = 0;
          if (0 < curFighterNum && 0 < gridSz) {
            iVar19 = 0;
            lVar3 = 2;
            uVar16 = 1;
            piVar18 = sign;
            iVar12 = 0;
            iVar11 = curFighterNum;
            do {
              if (*piVar18 == 1) {
                iVar11 = planeVecF.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar19].airSupremacy;
                iVar8 = 3;
                if (planeVecF.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar19].category == 3) {
                  iVar8 = 0x19;
                }
                dVar1 = (double)(&(gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                                   super__Vector_impl_data._M_start)->carrierPos)[lVar3];
                if (dVar1 < 0.0) {
                  dVar1 = sqrt(dVar1);
                }
                else {
                  dVar1 = SQRT(dVar1);
                }
                iVar12 = iVar8 + iVar12 + (int)((double)iVar11 * dVar1);
                iVar19 = iVar19 + 1;
                iVar11 = curFighterNum;
              }
              if (uVar10 <= uVar16) break;
              lVar3 = lVar3 + 6;
              uVar16 = uVar16 + 1;
              piVar18 = piVar18 + 1;
            } while (iVar19 < iVar11);
          }
          iVar11 = curBomberNum;
          if (0 < curBomberNum) {
            lVar9 = 0;
            lVar6 = 9;
            lVar3 = 0;
            iVar17 = 0;
            pPVar7 = planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              iVar8 = iVar17 + 3;
              iVar19 = *(int *)((long)&(pPVar7->name)._M_dataplus._M_p + lVar6 * 4);
              iVar17 = iVar17 + 0x19;
              if (*(int *)((long)pPVar7 + lVar6 * 4 + -4) != 3) {
                iVar17 = iVar8;
              }
              if (iVar19 != 0) {
                dVar1 = (double)theCarrier.super__Vector_base<Carrier,_std::allocator<Carrier>_>.
                                _M_impl.super__Vector_impl_data._M_start
                                [*(int *)((long)curAssign + lVar9)].gridSize
                                [*(int *)((long)curAssignGrid + lVar9)];
                if (dVar1 < 0.0) {
                  dVar1 = sqrt(dVar1);
                }
                else {
                  dVar1 = SQRT(dVar1);
                }
                iVar17 = iVar17 + (int)((double)iVar19 * dVar1);
                pPVar7 = planeVecA.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                         super__Vector_impl_data._M_start;
                iVar11 = curBomberNum;
              }
              lVar3 = lVar3 + 1;
              lVar9 = lVar9 + 4;
              lVar6 = lVar6 + 0xe;
            } while (lVar3 < iVar11);
          }
          iVar17 = iVar17 + iVar12;
          if (tarAirSupremacy <= iVar17) {
            resBomberNum = iVar11 - remainA;
            resAtk = fVar22;
            resAS = iVar17;
            if (0 < gridSz) {
              lVar3 = 0;
              do {
                *(int *)((long)resSign + lVar3) = *(int *)((long)sign + lVar3) + 0x30;
                lVar3 = lVar3 + 4;
              } while (local_98 != lVar3);
            }
            resSign[local_90] = 0;
            resAssign[0] = curAssign[0];
            resAssign[1] = curAssign[1];
            resAssign[2] = curAssign[2];
            resAssign[3] = curAssign[3];
            resAssign[4] = curAssign[4];
            resAssign[5] = curAssign[5];
            resAssign[6] = curAssign[6];
            resAssign[7] = curAssign[7];
            resAssign[8] = curAssign[8];
            resAssign[9] = curAssign[9];
            resAssign[10] = curAssign[10];
            resAssign[0xb] = curAssign[0xb];
            resAssign[0xc] = curAssign[0xc];
            resAssign[0xd] = curAssign[0xd];
            resAssign[0xe] = curAssign[0xe];
            resAssign[0xf] = curAssign[0xf];
            resAssignGrid[0xc] = curAssignGrid[0xc];
            resAssignGrid[0xd] = curAssignGrid[0xd];
            resAssignGrid[0xe] = curAssignGrid[0xe];
            resAssignGrid[0xf] = curAssignGrid[0xf];
            resAssignGrid[8] = curAssignGrid[8];
            resAssignGrid[9] = curAssignGrid[9];
            resAssignGrid[10] = curAssignGrid[10];
            resAssignGrid[0xb] = curAssignGrid[0xb];
            resAssignGrid[4] = curAssignGrid[4];
            resAssignGrid[5] = curAssignGrid[5];
            resAssignGrid[6] = curAssignGrid[6];
            resAssignGrid[7] = curAssignGrid[7];
            resAssignGrid[0] = curAssignGrid[0];
            resAssignGrid[1] = curAssignGrid[1];
            resAssignGrid[2] = curAssignGrid[2];
            resAssignGrid[3] = curAssignGrid[3];
            if (flushFlag == true) {
              std::vector<Plane,_std::allocator<Plane>_>::operator=(&ResPlaneVecA,&planeVecA);
              flushFlag = false;
            }
          }
        }
        local_80 = local_80 + 1;
        ppiVar14 = ppiVar14 + 1;
      } while (ppiVar14 != local_88);
    }
  }
  else {
    if (remainF != 0) {
      sign[curlv] = 1;
      baoliSearch(curlv + 1,remainF + -1,remainA,gridSz);
      sign[curlv] = 0;
    }
    if (remainA != 0) {
      sign[curlv] = 2;
      iVar17 = 0x32;
      if (0 < curFighterNum && 0 < gridSz) {
        iVar11 = 0;
        lVar3 = 2;
        piVar18 = sign;
        uVar10 = 1;
        iVar17 = 0;
        iVar12 = curFighterNum;
        do {
          if ((uint)*piVar18 < 2) {
            iVar12 = planeVecF.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar11].airSupremacy;
            iVar19 = 3;
            if (planeVecF.super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                super__Vector_impl_data._M_start[iVar11].category == 3) {
              iVar19 = 0x19;
            }
            dVar1 = (double)(&(gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.
                               super__Vector_impl_data._M_start)->carrierPos)[lVar3];
            if (dVar1 < 0.0) {
              dVar1 = sqrt(dVar1);
            }
            else {
              dVar1 = SQRT(dVar1);
            }
            iVar17 = iVar19 + iVar17 + (int)((double)iVar12 * dVar1);
            iVar11 = iVar11 + 1;
            iVar12 = curFighterNum;
          }
          if ((uint)gridSz <= uVar10) break;
          lVar3 = lVar3 + 6;
          uVar10 = uVar10 + 1;
          piVar18 = (int *)((uint *)piVar18 + 1);
        } while (iVar11 < iVar12);
        iVar17 = iVar17 + 0x32;
      }
      if (tarAirSupremacy <= curBomberNum * 3 + iVar17) {
        if (gridVec.super__Vector_base<Grid,_std::allocator<Grid>_>._M_impl.super__Vector_impl_data.
            _M_start[curlv].isFighterOnly == 0) {
          remainA = remainA + -1;
        }
        else {
          sign[curlv] = 0;
        }
        baoliSearch(curlv + 1,remainF,remainA,gridSz);
      }
      sign[curlv] = 0;
    }
  }
  return;
}

Assistant:

void baoliSearch(int curlv,int remainF,int remainA,int gridSz){
    if(curlv == gridSz || (remainF == 0 && remainA == 0)){//�ݹ�����
        if(restime=std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::system_clock::now()-logtime),restime.count()>TLE*1000000){
            cout<<"ERROR:TLE"<<endl;
            exit(0);
        }
        int tAssignN[4] = {0, 0, 0, 0};
        getAssignN(tAssignN, gridSz);//sav avail grids num to ships
        BelongStructure &curres=dpRes[tAssignN[0]][tAssignN[1]][tAssignN[2]][tAssignN[3]];
        vector<int *> &tlist=curres.belongings;
        int i=0;
        for(vector<int *>::iterator iter=tlist.begin(),end=tlist.end();iter!=end;++iter){
            getCurAssign(iter);
            float newAtk = curres.as[i++] + op_coef * calOPAtk(gridSz);
            if(newAtk > resAtk){
                int newAS = calAS(gridSz) + calASofBomber(gridSz);
                if(newAS >= tarAirSupremacy){
                    //write cur data to res
                    resAtk = newAtk;
                    resAS = newAS;
                    resBomberNum = curBomberNum - remainA;
                    copySign2Res(resSign, gridSz);
                    copyCurAssign2Res(resAssign,resAssignGrid);

                    if(flushFlag){
                        ResPlaneVecA = planeVecA;
                        flushFlag = 0;
                    }
                }
            }
        }
        return;
    }
    if(remainF){//���Է���ս���������ⷣվ
        sign[curlv]=1;
        baoliSearch(curlv+1,remainF-1,remainA,gridSz);
        sign[curlv]=0;
    }
    if(remainA){//���Է��ù�����
        sign[curlv]=2;
        if(cutF(curlv+1,remainF,gridSz)){
            if(gridVec[curlv].isFighterOnly){
                sign[curlv]=0;
                baoliSearch(curlv+1,remainF,remainA,gridSz);
            }
            else{
                baoliSearch(curlv+1,remainF,remainA-1,gridSz);
            }
        }
        sign[curlv]=0;
    }
}